

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow *window,bool snap_on_edges)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  IVar1 = window->Scroll;
  fVar3 = (window->ScrollTarget).x;
  if (fVar3 < 3.4028235e+38) {
    IVar1.x = fVar3 - ((window->SizeFull).x - (window->ScrollbarSizes).x) *
                      (window->ScrollTargetCenterRatio).x;
  }
  fVar3 = (window->ScrollTarget).y;
  if (fVar3 < 3.4028235e+38) {
    fVar4 = (window->ScrollTargetCenterRatio).y;
    if (((snap_on_edges) && (fVar4 <= 0.0)) && (fVar3 <= (window->WindowPadding).y)) {
      fVar3 = 0.0;
    }
    if (((snap_on_edges) && (1.0 <= fVar4)) &&
       (fVar5 = (window->SizeContents).y,
       (fVar5 - (window->WindowPadding).y) + (GImGui->Style).ItemSpacing.y <= fVar3)) {
      fVar3 = fVar5;
    }
    fVar6 = 0.0;
    fVar5 = 0.0;
    if ((window->Flags & 1U) == 0) {
      fVar5 = (GImGui->Style).FramePadding.y;
      fVar5 = fVar5 + fVar5 + GImGui->FontBaseSize * window->FontWindowScale;
    }
    if (((uint)window->Flags >> 10 & 1) != 0) {
      fVar6 = (GImGui->Style).FramePadding.y;
      fVar6 = fVar6 + fVar6 +
              GImGui->FontBaseSize * window->FontWindowScale + (window->DC).MenuBarOffset.y;
    }
    IVar1.y = (fVar3 - (1.0 - fVar4) * (fVar5 + fVar6)) -
              fVar4 * ((window->SizeFull).y - (window->ScrollbarSizes).y);
  }
  fVar3 = (float)(-(uint)(0.0 <= IVar1.x) & (uint)IVar1.x);
  fVar4 = (float)(-(uint)(0.0 <= IVar1.y) & (uint)IVar1.y);
  IVar2.y = fVar4;
  IVar2.x = fVar3;
  if ((window->Collapsed == false) && (window->SkipItems == false)) {
    fVar5 = (window->SizeContents).x - ((window->SizeFull).x - (window->ScrollbarSizes).x);
    fVar5 = (float)(~-(uint)(fVar5 <= 0.0) & (uint)fVar5);
    if (fVar5 <= fVar3) {
      fVar3 = fVar5;
    }
    fVar5 = (window->SizeContents).y - ((window->SizeFull).y - (window->ScrollbarSizes).y);
    fVar5 = (float)(~-(uint)(fVar5 <= 0.0) & (uint)fVar5);
    if (fVar5 <= fVar4) {
      fVar4 = fVar5;
    }
    IVar2.y = fVar4;
    IVar2.x = fVar3;
  }
  return IVar2;
}

Assistant:

static ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow* window, bool snap_on_edges)
{
    ImGuiContext& g = *GImGui;
    ImVec2 scroll = window->Scroll;
    if (window->ScrollTarget.x < FLT_MAX)
    {
        float cr_x = window->ScrollTargetCenterRatio.x;
        scroll.x = window->ScrollTarget.x - cr_x * (window->SizeFull.x - window->ScrollbarSizes.x);
    }
    if (window->ScrollTarget.y < FLT_MAX)
    {
        // 'snap_on_edges' allows for a discontinuity at the edge of scrolling limits to take account of WindowPadding so that scrolling to make the last item visible scroll far enough to see the padding.
        float cr_y = window->ScrollTargetCenterRatio.y;
        float target_y = window->ScrollTarget.y;
        if (snap_on_edges && cr_y <= 0.0f && target_y <= window->WindowPadding.y)
            target_y = 0.0f;
        if (snap_on_edges && cr_y >= 1.0f && target_y >= window->SizeContents.y - window->WindowPadding.y + g.Style.ItemSpacing.y)
            target_y = window->SizeContents.y;
        scroll.y = target_y - (1.0f - cr_y) * (window->TitleBarHeight() + window->MenuBarHeight()) - cr_y * (window->SizeFull.y - window->ScrollbarSizes.y);
    }
    scroll = ImMax(scroll, ImVec2(0.0f, 0.0f));
    if (!window->Collapsed && !window->SkipItems)
    {
        scroll.x = ImMin(scroll.x, ImGui::GetWindowScrollMaxX(window));
        scroll.y = ImMin(scroll.y, ImGui::GetWindowScrollMaxY(window));
    }
    return scroll;
}